

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idxset.cpp
# Opt level: O0

int __thiscall soplex::IdxSet::remove(IdxSet *this,char *__filename)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int in_EDX;
  int newnum;
  int cpy;
  int local_24;
  int local_14;
  
  iVar1 = in_EDX + 1;
  local_24 = iVar1 - (int)__filename;
  iVar2 = this->num - local_24;
  iVar3 = size(this);
  if (iVar3 - iVar1 < local_24) {
    local_24 = size(this);
    local_24 = local_24 - iVar1;
  }
  local_14 = local_24;
  do {
    this->num = this->num + -1;
    local_14 = local_14 + -1;
    this->idx[(int)__filename + local_14] = this->idx[this->num];
  } while (0 < local_14);
  this->num = iVar2;
  return (int)this;
}

Assistant:

void IdxSet::remove(int n, int m)
{
   assert(n <= m && m < size() && n >= 0);
   ++m;

   int cpy = m - n;
   int newnum = num - cpy;
   cpy = (size() - m >= cpy) ? cpy : size() - m;

   do
   {
      --num;
      --cpy;
      idx[n + cpy] = idx[num];
   }
   while(cpy > 0);

   num = newnum;
}